

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::RequiredExtensions::add
          (RequiredExtensions *this,char *ext)

{
  pointer *pppcVar1;
  deBool dVar2;
  pointer ppcVar3;
  iterator __position;
  long lVar4;
  char *local_20;
  
  ppcVar3 = (this->m_extensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->m_extensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_20 = ext;
  if (0 < (int)((ulong)((long)__position._M_current - (long)ppcVar3) >> 3)) {
    lVar4 = 0;
    do {
      dVar2 = deStringEqual(ppcVar3[lVar4],ext);
      if (dVar2 == 1) {
        return;
      }
      lVar4 = lVar4 + 1;
      ppcVar3 = (this->m_extensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      __position._M_current =
           (this->m_extensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
    } while (lVar4 < (int)((ulong)((long)__position._M_current - (long)ppcVar3) >> 3));
  }
  if (__position._M_current ==
      (this->m_extensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
              ((vector<char_const*,std::allocator<char_const*>> *)this,__position,&local_20);
  }
  else {
    *__position._M_current = ext;
    pppcVar1 = &(this->m_extensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  return;
}

Assistant:

void RequiredExtensions::add (const char* ext)
{
	for (int ndx = 0; ndx < (int)m_extensions.size(); ++ndx)
		if (deStringEqual(m_extensions[ndx], ext) == DE_TRUE)
			return;
	m_extensions.push_back(ext);
}